

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Expr * substExpr(SubstContext *pSubst,Expr *pExpr)

{
  byte *pbVar1;
  u8 uVar2;
  short sVar3;
  int iVar4;
  Select *pSVar5;
  sqlite3 *db;
  Window *pWVar6;
  ExprList *pEVar7;
  bool bVar8;
  int iVar9;
  Expr *pEVar10;
  CollSeq *pCVar11;
  CollSeq *pCVar12;
  u8 uVar13;
  uint joinFlag;
  Select *pSVar14;
  char *zC;
  ExprList **ppEVar15;
  ExprList_item *pEVar16;
  long lVar17;
  Expr ifNullRow;
  Expr local_78;
  
  if (pExpr == (Expr *)0x0) {
    return (Expr *)0x0;
  }
  if (((pExpr->flags & 3) != 0) && ((pExpr->w).iJoin == pSubst->iTable)) {
    pExpr->w = (anon_union_4_2_009eaf8f_for_w)pSubst->iNewTable;
  }
  if (pExpr->op == 0xb3) {
    if (pExpr->iTable == pSubst->iTable) {
      pExpr->iTable = pSubst->iNewTable;
    }
LAB_00183fee:
    pEVar10 = substExpr(pSubst,pExpr->pLeft);
    pExpr->pLeft = pEVar10;
    pEVar10 = substExpr(pSubst,pExpr->pRight);
    pExpr->pRight = pEVar10;
    pSVar5 = (Select *)(pExpr->x).pList;
    if ((pExpr->flags & 0x1000) == 0) {
      if ((pSVar5 != (Select *)0x0) &&
         (iVar9._0_1_ = pSVar5->op, iVar9._1_1_ = pSVar5->field_0x1,
         iVar9._2_2_ = pSVar5->nSelectRow, 0 < iVar9)) {
        ppEVar15 = (ExprList **)&pSVar5->iLimit;
        lVar17 = 0;
        do {
          pEVar10 = substExpr(pSubst,(Expr *)*ppEVar15);
          *ppEVar15 = (ExprList *)pEVar10;
          lVar17 = lVar17 + 1;
          iVar4._0_1_ = pSVar5->op;
          iVar4._1_1_ = pSVar5->field_0x1;
          iVar4._2_2_ = pSVar5->nSelectRow;
          ppEVar15 = ppEVar15 + 3;
        } while (lVar17 < iVar4);
      }
    }
    else {
      substSelect(pSubst,pSVar5,1);
    }
    if ((pExpr->flags & 0x1000000) != 0) {
      pWVar6 = (pExpr->y).pWin;
      pEVar10 = substExpr(pSubst,pWVar6->pFilter);
      pWVar6->pFilter = pEVar10;
      pEVar7 = pWVar6->pPartition;
      if ((pEVar7 != (ExprList *)0x0) && (0 < pEVar7->nExpr)) {
        pEVar16 = pEVar7->a;
        lVar17 = 0;
        do {
          pEVar10 = substExpr(pSubst,pEVar16->pExpr);
          pEVar16->pExpr = pEVar10;
          lVar17 = lVar17 + 1;
          pEVar16 = pEVar16 + 1;
        } while (lVar17 < pEVar7->nExpr);
      }
      pEVar7 = pWVar6->pOrderBy;
      if ((pEVar7 != (ExprList *)0x0) && (0 < pEVar7->nExpr)) {
        pEVar16 = pEVar7->a;
        lVar17 = 0;
        do {
          pEVar10 = substExpr(pSubst,pEVar16->pExpr);
          pEVar16->pExpr = pEVar10;
          lVar17 = lVar17 + 1;
          pEVar16 = pEVar16 + 1;
        } while (lVar17 < pEVar7->nExpr);
      }
    }
    return pExpr;
  }
  if (((pExpr->op != 0xa7) || ((pExpr->flags & 0x20) != 0)) || (pExpr->iTable != pSubst->iTable))
  goto LAB_00183fee;
  sVar3 = pExpr->iColumn;
  pSVar5 = (Select *)pSubst->pEList->a[sVar3].pExpr;
  uVar2 = pSVar5->op;
  uVar13 = uVar2;
  if (uVar2 == 0xb0) {
    uVar13 = *(u8 *)&pSVar5->nSelectRow;
  }
  pSVar14 = pSVar5;
  if (uVar13 != 0xb1) {
    bVar8 = true;
    if (uVar13 != 0x8a) goto LAB_00183f41;
    pSVar14 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar5->pEList)->pSelect;
  }
  bVar8 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar14->pEList)->pList->nExpr < 2;
LAB_00183f41:
  if (!bVar8) {
    sqlite3VectorErrorMsg(pSubst->pParse,(Expr *)pSVar5);
    return pExpr;
  }
  db = pSubst->pParse->db;
  pSVar14 = pSVar5;
  if ((pSubst->isOuterJoin != 0) &&
     ((uVar2 != 0xa7 || (*(int *)((long)&pSVar5->pSrc + 4) != pSubst->iNewTable)))) {
    local_78.u.zToken = (char *)0x0;
    local_78.pRight = (Expr *)0x0;
    local_78.pAggInfo = (AggInfo *)0x0;
    local_78.x.pList = (ExprList *)0x0;
    local_78.y.pTab = (Table *)0x0;
    local_78._40_8_ = (ulong)(uint)pSubst->iNewTable << 0x20;
    local_78.iColumn = -99;
    local_78.iAgg = 0;
    local_78.w = (anon_union_4_2_009eaf8f_for_w)0x0;
    local_78.op = 0xb3;
    local_78.affExpr = '\0';
    local_78.op2 = '\0';
    local_78._3_1_ = 0;
    local_78.flags = 0x40000;
    pSVar14 = (Select *)&local_78;
    local_78.pLeft = (Expr *)pSVar5;
  }
  pEVar10 = exprDup(db,(Expr *)pSVar14,0,(EdupBuf *)0x0);
  if (db->mallocFailed == '\0') {
    if (pSubst->isOuterJoin != 0) {
      pbVar1 = (byte *)((long)&pEVar10->flags + 2);
      *pbVar1 = *pbVar1 | 0x20;
    }
    joinFlag = pExpr->flags & 3;
    if (joinFlag != 0) {
      sqlite3SetJoinExpr(pEVar10,(pExpr->w).iJoin,joinFlag);
    }
    sqlite3ExprDeleteNN(db,pExpr);
    if (pEVar10->op == 0xaa) {
      iVar9 = sqlite3ExprTruthValue(pEVar10);
      (pEVar10->u).iValue = iVar9;
      pEVar10->op = 0x9b;
      pbVar1 = (byte *)((long)&pEVar10->flags + 1);
      *pbVar1 = *pbVar1 | 8;
    }
    pCVar11 = sqlite3ExprCollSeq(pSubst->pParse,pEVar10);
    pCVar12 = sqlite3ExprCollSeq(pSubst->pParse,pSubst->pCList->a[sVar3].pExpr);
    if ((pCVar11 != pCVar12) || ((pEVar10->op != 'q' && (pEVar10->op != 0xa7)))) {
      if (pCVar12 == (CollSeq *)0x0) {
        zC = "BINARY";
      }
      else {
        zC = pCVar12->zName;
      }
      pEVar10 = sqlite3ExprAddCollateString(pSubst->pParse,pEVar10,zC);
    }
    pbVar1 = (byte *)((long)&pEVar10->flags + 1);
    *pbVar1 = *pbVar1 & 0xfd;
    return pEVar10;
  }
  if (pEVar10 == (Expr *)0x0) {
    return pExpr;
  }
  sqlite3ExprDeleteNN(db,pEVar10);
  return pExpr;
}

Assistant:

static Expr *substExpr(
  SubstContext *pSubst,  /* Description of the substitution */
  Expr *pExpr            /* Expr in which substitution occurs */
){
  if( pExpr==0 ) return 0;
  if( ExprHasProperty(pExpr, EP_OuterON|EP_InnerON)
   && pExpr->w.iJoin==pSubst->iTable
  ){
    testcase( ExprHasProperty(pExpr, EP_InnerON) );
    pExpr->w.iJoin = pSubst->iNewTable;
  }
  if( pExpr->op==TK_COLUMN
   && pExpr->iTable==pSubst->iTable
   && !ExprHasProperty(pExpr, EP_FixedCol)
  ){
#ifdef SQLITE_ALLOW_ROWID_IN_VIEW
    if( pExpr->iColumn<0 ){
      pExpr->op = TK_NULL;
    }else
#endif
    {
      Expr *pNew;
      int iColumn;
      Expr *pCopy;
      Expr ifNullRow;
      iColumn = pExpr->iColumn;
      assert( iColumn>=0 );
      assert( pSubst->pEList!=0 && iColumn<pSubst->pEList->nExpr );
      assert( pExpr->pRight==0 );
      pCopy = pSubst->pEList->a[iColumn].pExpr;
      if( sqlite3ExprIsVector(pCopy) ){
        sqlite3VectorErrorMsg(pSubst->pParse, pCopy);
      }else{
        sqlite3 *db = pSubst->pParse->db;
        if( pSubst->isOuterJoin
         && (pCopy->op!=TK_COLUMN || pCopy->iTable!=pSubst->iNewTable)
        ){
          memset(&ifNullRow, 0, sizeof(ifNullRow));
          ifNullRow.op = TK_IF_NULL_ROW;
          ifNullRow.pLeft = pCopy;
          ifNullRow.iTable = pSubst->iNewTable;
          ifNullRow.iColumn = -99;
          ifNullRow.flags = EP_IfNullRow;
          pCopy = &ifNullRow;
        }
        testcase( ExprHasProperty(pCopy, EP_Subquery) );
        pNew = sqlite3ExprDup(db, pCopy, 0);
        if( db->mallocFailed ){
          sqlite3ExprDelete(db, pNew);
          return pExpr;
        }
        if( pSubst->isOuterJoin ){
          ExprSetProperty(pNew, EP_CanBeNull);
        }
        if( ExprHasProperty(pExpr,EP_OuterON|EP_InnerON) ){
          sqlite3SetJoinExpr(pNew, pExpr->w.iJoin,
                             pExpr->flags & (EP_OuterON|EP_InnerON));
        }
        sqlite3ExprDelete(db, pExpr);
        pExpr = pNew;
        if( pExpr->op==TK_TRUEFALSE ){
          pExpr->u.iValue = sqlite3ExprTruthValue(pExpr);
          pExpr->op = TK_INTEGER;
          ExprSetProperty(pExpr, EP_IntValue);
        }

        /* Ensure that the expression now has an implicit collation sequence,
        ** just as it did when it was a column of a view or sub-query. */
        {
          CollSeq *pNat = sqlite3ExprCollSeq(pSubst->pParse, pExpr);
          CollSeq *pColl = sqlite3ExprCollSeq(pSubst->pParse,
                pSubst->pCList->a[iColumn].pExpr
          );
          if( pNat!=pColl || (pExpr->op!=TK_COLUMN && pExpr->op!=TK_COLLATE) ){
            pExpr = sqlite3ExprAddCollateString(pSubst->pParse, pExpr,
                (pColl ? pColl->zName : "BINARY")
            );
          }
        }
        ExprClearProperty(pExpr, EP_Collate);
      }
    }
  }else{
    if( pExpr->op==TK_IF_NULL_ROW && pExpr->iTable==pSubst->iTable ){
      pExpr->iTable = pSubst->iNewTable;
    }
    pExpr->pLeft = substExpr(pSubst, pExpr->pLeft);
    pExpr->pRight = substExpr(pSubst, pExpr->pRight);
    if( ExprUseXSelect(pExpr) ){
      substSelect(pSubst, pExpr->x.pSelect, 1);
    }else{
      substExprList(pSubst, pExpr->x.pList);
    }
#ifndef SQLITE_OMIT_WINDOWFUNC
    if( ExprHasProperty(pExpr, EP_WinFunc) ){
      Window *pWin = pExpr->y.pWin;
      pWin->pFilter = substExpr(pSubst, pWin->pFilter);
      substExprList(pSubst, pWin->pPartition);
      substExprList(pSubst, pWin->pOrderBy);
    }
#endif
  }
  return pExpr;
}